

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O3

bool tcmalloc::DoForEachProcMapping(_func_void_ProcMapping_ptr_void_ptr *body,void *arg)

{
  char **endptr;
  char *__src;
  bool bVar1;
  int __fd;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  char **in_RCX;
  int base;
  char **in_R8;
  int iVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  char *__s;
  char *pcVar9;
  char local_14a8 [8];
  char buf [5120];
  ProcMapping local_a0;
  void *local_70;
  _func_void_ProcMapping_ptr_void_ptr *local_68;
  char local_5a [4];
  undefined1 local_56;
  char flags_tmp [10];
  int64_t dummy;
  char *local_40;
  uint local_34;
  
  local_70 = arg;
  local_68 = body;
  do {
    __fd = open("/proc/self/maps",0);
    if (-1 < __fd) {
      __s = local_14a8;
      local_34 = 0;
      pcVar9 = __s;
      goto LAB_0011a510;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
LAB_0011a772:
  return -1 < __fd;
LAB_0011a510:
  do {
    lVar7 = ((long)pcVar9 << 0x20) - ((long)__s << 0x20);
    sVar6 = (long)pcVar9 - (long)__s;
    while( true ) {
      pcVar3 = (char *)memchr(__s,10,sVar6);
      iVar5 = (int)in_RCX;
      if (pcVar3 != (char *)0x0) break;
      if ((local_34 & 1) == 0) {
        sVar6 = lVar7 >> 0x20;
        memmove(local_14a8,__s,sVar6);
        goto LAB_0011a704;
      }
      if ((int)sVar6 == 0) goto LAB_0011a768;
      *pcVar9 = '\n';
      pcVar9 = pcVar9 + 1;
      lVar7 = lVar7 + 0x100000000;
      sVar6 = sVar6 + 1;
      local_34 = 1;
    }
    if (pcVar9 <= pcVar3) {
      syscall(1,2,"Check failed: nextline < ebuf: BUG\n",0x23);
      abort();
    }
    *pcVar3 = '\0';
    endptr = (char **)(flags_tmp + 2);
    local_40 = __s;
    if (*__s == '\0') break;
    bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                      (&local_a0.start,(char *)0x2d,(int)&local_40,iVar5,in_R8);
    if (((!bVar1) ||
        (bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                           (&local_a0.end,(char *)0x20,(int)&local_40,iVar5,in_R8), __src = local_40
        , !bVar1)) || (bVar1 = anon_unknown_0::ExtractUntilChar(local_40,0x20,endptr), !bVar1))
    break;
    strncpy(local_5a,__src,5);
    local_56 = 0;
    *(undefined1 *)flags_tmp._2_8_ = 0x20;
    anon_unknown_0::SkipWhileWhitespace(endptr,0x20);
    in_RCX = &local_40;
    if ((flags_tmp._2_8_ == 0) || (*(char *)flags_tmp._2_8_ == '\0')) break;
    local_40 = (char *)(flags_tmp._2_8_ + 1);
    base = (int)in_RCX;
    bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                      (&local_a0.offset,(char *)0x20,base,iVar5,in_R8);
    if (((!bVar1) ||
        ((bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                            ((long *)endptr,(char *)0x10,0x3a,base,in_R8), !bVar1 ||
         (bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                            ((long *)endptr,(char *)0x10,0x20,base,in_R8), !bVar1)))) ||
       (bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                          (&local_a0.inode,(char *)0xa,0x20,base,in_R8), !bVar1)) break;
    local_a0.filename = __s + (uint)((int)local_40 - (int)__s);
    local_a0.flags = local_5a;
    (*local_68)(&local_a0,local_70);
    __s = pcVar3 + 1;
  } while( true );
  uVar8 = (int)pcVar3 - (int)__s;
  fprintf(_stderr,"bad line %d:\n%.*s\n----\n",(ulong)uVar8,(ulong)uVar8,__s);
LAB_0011a768:
  close(__fd);
  goto LAB_0011a772;
  while (piVar2 = __errno_location(), *piVar2 == 4) {
LAB_0011a704:
    uVar4 = read(__fd,local_14a8 + sVar6,0x13ff - sVar6);
    iVar5 = (int)uVar4;
    if (-1 < iVar5) break;
  }
  uVar4 = uVar4 & 0xffffffff;
  if (iVar5 < 1) {
    uVar4 = 0;
  }
  local_34 = (uint)(iVar5 < 1);
  pcVar9 = local_14a8 + sVar6 + uVar4;
  __s = local_14a8;
  goto LAB_0011a510;
}

Assistant:

bool DoForEachProcMapping(void (*body)(const ProcMapping& mapping, void* arg), void* arg) {
#if defined TCMALLOC_WANT_DL_ITERATE_PHDR
  auto callback = [&] (struct dl_phdr_info *info, size_t _size) -> int {
    ProcMapping mapping;
    memset(&mapping, 0, sizeof(mapping));
    uintptr_t addr = info->dlpi_addr;
    if (!info->dlpi_name || info->dlpi_name[0] == 0) {
      mapping.filename = tcmalloc::GetProgramInvocationName();
      if (!mapping.filename) {
        mapping.filename = "";
      }
    } else {
      mapping.filename = info->dlpi_name;
    }
    for (int i = 0; i < info->dlpi_phnum; i++) {
      auto phdr = info->dlpi_phdr + i;
      if (phdr->p_type != PT_LOAD) {
        continue;
      }
      uint64_t vaddr = phdr->p_vaddr + addr;
      uint64_t align = phdr->p_align;
      uint64_t offset = phdr->p_offset;
      uint64_t size = phdr->p_filesz;
      uint64_t start_adj = vaddr & (align - 1); // amount we need to round down to align start
      uint64_t end_adj = (~(vaddr + size) + 1) & (align - 1); // likewise, but for end of mapping

      vaddr -= start_adj;
      offset -= start_adj;
      size += start_adj + end_adj;
      CHECK_EQ((size & (align - 1)), 0);

      char flags[5] = "---p";
      auto fl = phdr->p_flags;
      if ((fl & PF_R)) {
        flags[0] = 'r';
      }
      if ((fl & PF_W)) {
        flags[1] = 'w';
      }
      if ((fl & PF_X)) {
        flags[2] = 'x';
      }

      mapping.start = vaddr;
      mapping.end = vaddr + size;
      mapping.flags = flags;
      mapping.offset = offset;
      mapping.inode = 0;

      body(mapping, arg);
    }

    return 0;
  };

  tcmalloc::FunctionRef<int(struct dl_phdr_info *, size_t)> ref{callback};
  (void)dl_iterate_phdr(ref.fn, ref.data);

  return true;
#elif defined(PLATFORM_WINDOWS)
  return DoIterateWindows(body, arg);
#elif defined(__MACH__)
  return DoIterateOSX(body, arg);
#elif defined(__sun__)
  return DoIterateSolaris(body, arg);
#elif defined(__QNXNTO__)
  return DoIterateQNX(body, arg);
#elif defined(__FreeBSD__)
  return DoIterateFreeBSD(body, arg);
#else
  return DoIterateLinux("/proc/self/maps", body, arg);
#endif
}